

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O0

HighsInt __thiscall HFactor::build(HFactor *this,HighsTimerClock *factor_timer_clock_pointer)

{
  bool bVar1;
  HighsInt HVar2;
  reference pvVar3;
  HFactor *in_RDI;
  HFactor *in_stack_00000030;
  HighsInt basic_index_rank_deficiency;
  bool incomplete_basis;
  HighsInt build_kernel_return;
  FactorTimer factor_timer;
  bool report_lu;
  HighsTimer build_timer;
  HFactor *in_stack_00000160;
  HFactor *in_stack_00000268;
  HighsTimerClock *in_stack_00000290;
  HFactor *in_stack_00000298;
  HighsInt in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  HighsInt in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  value_type vVar4;
  HighsInt in_stack_ffffffffffffff2c;
  HighsTimer *log_options;
  undefined4 in_stack_ffffffffffffff44;
  uint highs_debug_level;
  uint in_stack_ffffffffffffff50;
  uint kernel_num_el;
  undefined4 in_stack_ffffffffffffff54;
  HighsInt in_stack_ffffffffffffff58;
  HFactor *in_stack_ffffffffffffffb0;
  int local_4;
  
  log_options = (HighsTimer *)&stack0xffffffffffffff60;
  HighsTimer::HighsTimer
            ((HighsTimer *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  in_RDI->build_timer_ = log_options;
  HighsTimer::start((HighsTimer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                    in_stack_ffffffffffffff1c);
  kernel_num_el = in_stack_ffffffffffffff50 & 0xffffff;
  if (((in_RDI->refactor_info_).use & 1U) != 0) {
    FactorTimer::start((FactorTimer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       in_stack_ffffffffffffff1c,
                       (HighsTimerClock *)
                       CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    in_stack_ffffffffffffff2c = rebuild(in_stack_00000298,in_stack_00000290);
    in_RDI->rank_deficiency = in_stack_ffffffffffffff2c;
    FactorTimer::stop((FactorTimer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                      in_stack_ffffffffffffff1c,
                      (HighsTimerClock *)
                      CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    if (in_RDI->rank_deficiency == 0) {
      local_4 = 0;
      goto LAB_007c9b1c;
    }
  }
  RefactorInfo::clear((RefactorInfo *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10))
  ;
  FactorTimer::start((FactorTimer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     in_stack_ffffffffffffff1c,
                     (HighsTimerClock *)
                     CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  in_RDI->build_synthetic_tick = 0.0;
  FactorTimer::start((FactorTimer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     in_stack_ffffffffffffff1c,
                     (HighsTimerClock *)
                     CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  buildSimple(in_stack_00000160);
  FactorTimer::stop((FactorTimer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                    in_stack_ffffffffffffff1c,
                    (HighsTimerClock *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)
                   );
  FactorTimer::start((FactorTimer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     in_stack_ffffffffffffff1c,
                     (HighsTimerClock *)
                     CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  HVar2 = buildKernel(in_stack_00000268);
  FactorTimer::stop((FactorTimer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                    in_stack_ffffffffffffff1c,
                    (HighsTimerClock *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)
                   );
  if (HVar2 == -1) {
    local_4 = -1;
  }
  else {
    in_RDI->rank_deficiency = HVar2;
    bVar1 = in_RDI->num_basic < in_RDI->num_row;
    highs_debug_level = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff44);
    if ((in_RDI->rank_deficiency != 0) || (bVar1)) {
      FactorTimer::start((FactorTimer *)
                         CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                         in_stack_ffffffffffffff1c,
                         (HighsTimerClock *)
                         CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      if (in_RDI->num_basic == in_RDI->num_row) {
        highsLogDev(&in_RDI->log_options,kWarning,
                    "Rank deficiency of %d identified in basis matrix\n",
                    (ulong)(uint)in_RDI->rank_deficiency);
      }
      buildHandleRankDeficiency(in_stack_ffffffffffffffb0);
      buildMarkSingC(in_RDI);
      FactorTimer::stop((FactorTimer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                        ,in_stack_ffffffffffffff1c,
                        (HighsTimerClock *)
                        CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    }
    if ((highs_debug_level & 0x1000000) == 0) {
      FactorTimer::start((FactorTimer *)
                         CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                         in_stack_ffffffffffffff1c,
                         (HighsTimerClock *)
                         CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      buildFinish(in_stack_00000030);
      FactorTimer::stop((FactorTimer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                        ,in_stack_ffffffffffffff1c,
                        (HighsTimerClock *)
                        CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      if (in_RDI->rank_deficiency == 0) {
        (in_RDI->refactor_info_).build_synthetic_tick = in_RDI->build_synthetic_tick;
      }
      else {
        RefactorInfo::clear((RefactorInfo *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      }
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&in_RDI->l_start,(long)in_RDI->num_row);
      vVar4 = *pvVar3;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&in_RDI->u_last_p,(long)(in_RDI->num_row + -1));
      in_RDI->invert_num_el = vVar4 + *pvVar3 + in_RDI->num_row;
      in_RDI->kernel_dim = in_RDI->kernel_dim - in_RDI->rank_deficiency;
      in_stack_ffffffffffffff10 = in_RDI->nwork;
      debugLogRankDeficiency
                (highs_debug_level,(HighsLogOptions *)log_options,(HighsInt)((ulong)in_RDI >> 0x20),
                 (HighsInt)in_RDI,in_stack_ffffffffffffff2c,
                 (HighsInt *)CONCAT44(vVar4,in_stack_ffffffffffffff20),kernel_num_el,
                 in_stack_ffffffffffffff58);
      FactorTimer::stop((FactorTimer *)CONCAT44(vVar4,in_stack_ffffffffffffff20),
                        in_stack_ffffffffffffff1c,
                        (HighsTimerClock *)
                        CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      local_4 = in_RDI->rank_deficiency;
    }
    else {
      RefactorInfo::clear((RefactorInfo *)
                          CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      local_4 = in_RDI->rank_deficiency - (in_RDI->num_row - in_RDI->num_basic);
    }
  }
LAB_007c9b1c:
  HighsTimer::~HighsTimer
            ((HighsTimer *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  return local_4;
}

Assistant:

HighsInt HFactor::build(HighsTimerClock* factor_timer_clock_pointer) {
  // Set up a timer to prevent build running longer than time_limit_,
  // which is kHighsInf by default, and only set to a finite value in
  // HPresolve::removeDependentEquations
  HighsTimer build_timer;
  build_timer_ = &build_timer;
  build_timer.start();

  const bool report_lu = false;
  // Ensure that the A matrix is valid for factorization
  assert(this->a_matrix_valid);
  FactorTimer factor_timer;
  // Possibly use the refactorization information!
  if (refactor_info_.use) {
    factor_timer.start(FactorReinvert, factor_timer_clock_pointer);
    rank_deficiency = rebuild(factor_timer_clock_pointer);
    factor_timer.stop(FactorReinvert, factor_timer_clock_pointer);
    if (!rank_deficiency) return 0;
  }
  // Refactoring from just the list of basic variables. Initialise the
  // refactorization information.
  refactor_info_.clear();
  // Start the timer
  factor_timer.start(FactorInvert, factor_timer_clock_pointer);
  build_synthetic_tick = 0;
  factor_timer.start(FactorInvertSimple, factor_timer_clock_pointer);
  // Build the L, U factor
  buildSimple();
  if (report_lu) {
    printf("\nAfter units and singletons\n");
    reportLu(kReportLuBoth, false);
  }
  factor_timer.stop(FactorInvertSimple, factor_timer_clock_pointer);
  factor_timer.start(FactorInvertKernel, factor_timer_clock_pointer);
  const HighsInt build_kernel_return = buildKernel();
  factor_timer.stop(FactorInvertKernel, factor_timer_clock_pointer);
  //
  // build_kernel_return of kBuildKernelReturnTimeout (<0) indicates
  // that time limit has been reached, otherwise it's the rank
  // deficiency of the basic variables. If num_basic < num_row, then
  // have to identify the logicals required to complete the basis by
  // continuing as if a full-dimension set of basic variables was rank
  // deficient.
  if (build_kernel_return == kBuildKernelReturnTimeout)
    return kBuildKernelReturnTimeout;
  rank_deficiency = build_kernel_return;
  const bool incomplete_basis = num_basic < num_row;
  if (rank_deficiency || incomplete_basis) {
    factor_timer.start(FactorInvertDeficient, factor_timer_clock_pointer);
    if (num_basic == num_row)
      highsLogDev(log_options, HighsLogType::kWarning,
                  "Rank deficiency of %" HIGHSINT_FORMAT
                  " identified in basis matrix\n",
                  rank_deficiency);
    // Singular matrix B: reorder the basic variables so that the
    // singular columns are in the position corresponding to the
    // logical which replaces them
    buildHandleRankDeficiency();
    buildMarkSingC();
    factor_timer.stop(FactorInvertDeficient, factor_timer_clock_pointer);
  }
  if (incomplete_basis) {
    // Completing the factorization is not relevant if the basis
    // matrix is incomplete, so clear any refactorization information
    // and return
    this->refactor_info_.clear();
    assert(!this->refactor_info_.use);
    const HighsInt basic_index_rank_deficiency =
        rank_deficiency - (num_row - num_basic);
    return basic_index_rank_deficiency;
  }
  // Complete INVERT
  if (report_lu) {
    printf("\nFactored INVERT\n");
    reportLu(kReportLuBoth, false);
  }
  factor_timer.start(FactorInvertFinish, factor_timer_clock_pointer);
  buildFinish();
  factor_timer.stop(FactorInvertFinish, factor_timer_clock_pointer);
  //
  // Indicate that the refactorization information is known unless the basis was
  // rank deficient
  if (rank_deficiency) {
    this->refactor_info_.clear();
  } else {
    // Check that the refactorization information is not (yet) flagged
    // to be used in a future call
    assert(!this->refactor_info_.use);
    // Record build_synthetic_tick to use as the value of
    // build_synthetic_tick if refactorization is performed. Not only
    // is there no build_synthetic_tick measure for refactorization,
    // if there were it would give an unrealistic underestimate of the
    // cost of factorization from scratch
    this->refactor_info_.build_synthetic_tick = this->build_synthetic_tick;
  }

  // Record the number of entries in the INVERT
  invert_num_el = l_start[num_row] + u_last_p[num_row - 1] + num_row;

  kernel_dim -= rank_deficiency;
  debugLogRankDeficiency(highs_debug_level, log_options, rank_deficiency,
                         basis_matrix_num_el, invert_num_el, kernel_dim,
                         kernel_num_el, nwork);
  factor_timer.stop(FactorInvert, factor_timer_clock_pointer);
  return rank_deficiency;
}